

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * adios2sys::SystemTools::AppendStrings(char *str1,char *str2,char *str3)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *newstr;
  size_t len2;
  size_t len1;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = AppendStrings(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  else if (in_RSI == (char *)0x0) {
    local_8 = AppendStrings(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  else if (in_RDX == (char *)0x0) {
    local_8 = AppendStrings(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  else {
    sVar1 = strlen(in_RDI);
    sVar2 = strlen(in_RSI);
    lVar3 = sVar1 + sVar2;
    sVar4 = strlen(in_RDX);
    local_8 = (char *)operator_new__(lVar3 + sVar4 + 1);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      strcpy(local_8,in_RDI);
      strcat(local_8 + sVar1,in_RSI);
      strcat(local_8 + sVar2 + sVar1,in_RDX);
    }
  }
  return local_8;
}

Assistant:

char* SystemTools::AppendStrings(const char* str1, const char* str2,
                                 const char* str3)
{
  if (!str1) {
    return SystemTools::AppendStrings(str2, str3);
  }
  if (!str2) {
    return SystemTools::AppendStrings(str1, str3);
  }
  if (!str3) {
    return SystemTools::AppendStrings(str1, str2);
  }

  size_t len1 = strlen(str1), len2 = strlen(str2);
  char* newstr = new char[len1 + len2 + strlen(str3) + 1];
  if (!newstr) {
    return nullptr;
  }
  strcpy(newstr, str1);
  strcat(newstr + len1, str2);
  strcat(newstr + len1 + len2, str3);
  return newstr;
}